

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timetrans.cpp
# Opt level: O2

SATTIME __thiscall SATTIME::operator+(SATTIME *this,double *a)

{
  bool bVar1;
  double dVar2;
  SATTIME SVar3;
  
  dVar2 = this->SOW + *a;
  bVar1 = dVar2 < 604800.0;
  if (!bVar1) {
    dVar2 = dVar2 + -604800.0;
  }
  SVar3.Week = (this->Week + 1) - (uint)bVar1;
  SVar3._4_4_ = 0;
  SVar3.SOW = dVar2;
  return SVar3;
}

Assistant:

SATTIME SATTIME::operator+(const double &a) const
{
    SATTIME r;
    r.Week = this->Week;
    r.SOW = this->SOW + a;
    if(r.SOW >= 604800)
    {
        r.SOW -= 604800;
        r.Week += 1;
    }
    return r;
}